

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::TimeCoordinator::updateNextExecutionTime(TimeCoordinator *this)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> *pTVar2;
  TimeRepresentation<count_time<9,_long>_> this_00;
  Time TVar3;
  long in_RDI;
  Time cexec;
  TimeRepresentation<count_time<9,_long>_> *in_stack_ffffffffffffff68;
  TimeCoordinator *in_stack_ffffffffffffffa8;
  TimeRepresentation<count_time<9,_long>_> local_50;
  baseType local_48;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffc0;
  Time in_stack_ffffffffffffffc8;
  baseType local_30;
  TimeRepresentation<count_time<9,_long>_> local_28;
  undefined8 local_20;
  baseType local_18;
  TimeRepresentation<count_time<9,_long>_> local_10 [2];
  
  local_10[0].internalTimeCode = *(baseType *)(in_RDI + 0x160);
  if ((*(byte *)(in_RDI + 0x251) & 1) == 0) {
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       (in_stack_ffffffffffffff68,
                        (TimeRepresentation<count_time<9,_long>_> *)0x57a420);
    *(baseType *)(in_RDI + 0x160) = pTVar2->internalTimeCode;
    this_00 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffc0);
    if (bVar1) {
      TimeRepresentation<count_time<9,_long>_>::operator+=
                ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                 (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x230));
    }
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       (in_stack_ffffffffffffff68,
                        (TimeRepresentation<count_time<9,_long>_> *)0x57a496);
    *(baseType *)(in_RDI + 0x160) = pTVar2->internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130));
    if (bVar1) {
      if (*(char *)(in_RDI + 0x259) == '\0') {
        local_48 = (baseType)getNextPossibleTime(in_stack_ffffffffffffffa8);
      }
      else {
        local_48 = *(baseType *)(in_RDI + 0x130);
      }
      *(baseType *)(in_RDI + 0x160) = local_48;
    }
    local_50 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130),&local_50);
    if (bVar1) {
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                         (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130));
      if (bVar1) {
        TVar3 = generateAllowedTime(this_00.internalTimeCode,in_stack_ffffffffffffffc8);
        *(baseType *)(in_RDI + 0x160) = TVar3.internalTimeCode;
      }
    }
    else {
      TVar3 = generateAllowedTime(this_00.internalTimeCode,in_stack_ffffffffffffffc8);
      *(baseType *)(in_RDI + 0x160) = TVar3.internalTimeCode;
    }
  }
  else if (*(char *)(in_RDI + 0x259) == '\0') {
    local_20 = *(undefined8 *)(in_RDI + 0x138);
    local_18 = (baseType)
               generateAllowedTime(in_stack_ffffffffffffffc0.internalTimeCode,
                                   in_stack_ffffffffffffffc8);
    *(baseType *)(in_RDI + 0x160) = local_18;
  }
  else {
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       (in_stack_ffffffffffffff68,
                        (TimeRepresentation<count_time<9,_long>_> *)0x57a340);
    *(baseType *)(in_RDI + 0x160) = pTVar2->internalTimeCode;
    local_28 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),&local_28);
    if (bVar1) {
      TimeRepresentation<count_time<9,_long>_>::operator+=
                ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                 (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x230));
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130));
    if (bVar1) {
      local_30 = *(baseType *)(in_RDI + 0x130);
    }
    else {
      local_30 = (baseType)
                 generateAllowedTime(in_stack_ffffffffffffffc0.internalTimeCode,
                                     (Time)*(baseType *)(in_RDI + 0x138));
    }
    *(baseType *)(in_RDI + 0x160) = local_30;
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x160),local_10);
  return bVar1;
}

Assistant:

bool TimeCoordinator::updateNextExecutionTime()
{
    auto cexec = time_exec;
    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = generateAllowedTime(time_requested);
        } else {
            time_exec = std::min(time_message, time_value);
            if (time_exec < Time::maxVal()) {
                time_exec += info.inputDelay;
            }
            time_exec =
                (time_exec <= time_granted) ? time_granted : generateAllowedTime(time_requested);
        }
    } else {
        time_exec = std::min(time_message, time_value);
        if (time_exec < Time::maxVal()) {
            time_exec += info.inputDelay;
        }
        time_exec = std::min(time_requested, time_exec);
        if (time_exec <= time_granted) {
            time_exec = (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() :
                                                                         time_granted;
        }
        if (time_granted < Time::maxVal()) {
            if (time_exec > time_granted) {
                time_exec = generateAllowedTime(time_exec);
            }
        } else {
            time_exec = generateAllowedTime(time_exec);
        }
    }

    return (time_exec != cexec);
}